

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevdevice.h
# Opt level: O0

bool __thiscall EvdevDevice::addDevice(EvdevDevice *this,Input *input)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  value_type local_2c;
  int local_24;
  Input *pIStack_20;
  int fd;
  Input *input_local;
  EvdevDevice *this_local;
  
  pIStack_20 = input;
  input_local = (Input *)this;
  pcVar2 = (char *)std::__cxx11::string::data();
  iVar1 = access(pcVar2,0);
  if (iVar1 == -1) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: Cannot access \'");
    poVar3 = std::operator<<(poVar3,(string *)pIStack_20);
    poVar3 = std::operator<<(poVar3,"\'. Does it exist?");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::data();
    local_2c.fd = open(pcVar2,0x800);
    local_24 = local_2c.fd;
    if (local_2c.fd == 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: Cannot open \'");
      poVar3 = std::operator<<(poVar3,(string *)pIStack_20);
      poVar3 = std::operator<<(poVar3,"\'.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = false;
    }
    else {
      local_2c.role = pIStack_20->role;
      std::vector<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>::push_back
                (&this->_devices,&local_2c);
      poVar3 = std::operator<<((ostream *)&std::cout,"Successfully added device \'");
      poVar3 = std::operator<<(poVar3,(string *)pIStack_20);
      poVar3 = std::operator<<(poVar3,"\'.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool EvdevDevice::addDevice(Input const& input)
{
  if(access(input.path.data(), F_OK ) != -1)
  {
    int fd = open(input.path.data(), O_RDONLY | O_NDELAY);
    if(!fd)
    {
      std::cerr << "ERROR: Cannot open '" << input.path << "'." << std::endl;
      return false;
    }

    _devices.push_back({fd, input.role});
    std::cout << "Successfully added device '" << input.path << "'." << std::endl;
  }

  else
  {
    std::cerr << "ERROR: Cannot access '" << input.path << "'. Does it exist?" << std::endl;
    return false;
  }

  return true;
}